

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktQueryPoolStatisticsTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::QueryPool::anon_unknown_0::TessellationShaderTestInstance::checkResult
          (TestStatus *__return_storage_ptr__,TessellationShaderTestInstance *this,
          VkQueryPool queryPool)

{
  VkQueryPipelineStatisticFlags VVar1;
  bool bVar2;
  VkResult result_00;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_71;
  string local_70;
  TessellationShaderTestInstance *local_50;
  ulong local_48;
  deUint64 expectedMax;
  deUint64 expectedMin;
  deUint64 result;
  VkDevice device;
  DeviceInterface *vk;
  TessellationShaderTestInstance *this_local;
  VkQueryPool queryPool_local;
  
  vk = (DeviceInterface *)this;
  this_local = (TessellationShaderTestInstance *)queryPool.m_internal;
  queryPool_local.m_internal = (deUint64)__return_storage_ptr__;
  device = (VkDevice)
           Context::getDeviceInterface
                     ((this->super_GraphicBasicTestInstance).super_StatisticQueryTestInstance.
                      super_TestInstance.m_context);
  result = (deUint64)
           Context::getDevice((this->super_GraphicBasicTestInstance).
                              super_StatisticQueryTestInstance.super_TestInstance.m_context);
  expectedMin = 0;
  expectedMax = 0;
  local_48 = 0;
  VVar1 = ((this->super_GraphicBasicTestInstance).m_parametersGraphic)->queryStatisticFlags;
  if (VVar1 == 0x100) {
    expectedMax = 4;
    local_48 = 0x10;
  }
  else if (VVar1 == 0x200) {
    expectedMax = 100;
    local_48 = 400;
  }
  local_50 = this_local;
  result_00 = (**(code **)(*(long *)device + 0x100))
                        (device,result,this_local,0,1,8,&expectedMin,0,1);
  ::vk::checkResult(result_00,
                    "vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/query_pool/vktQueryPoolStatisticsTests.cpp"
                    ,0x723);
  if ((expectedMin < expectedMax) || (local_48 < expectedMin)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,"QueryPoolResults incorrect",&local_71);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator(&local_71);
  }
  else {
    bVar2 = GraphicBasicTestInstance::checkImage(&this->super_GraphicBasicTestInstance);
    if (bVar2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"Pass",&local_d1);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::allocator<char>::~allocator(&local_d1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_a8,"Result image doesn\'t match expected image.",&local_a9);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_a8);
      std::__cxx11::string::~string((string *)&local_a8);
      std::allocator<char>::~allocator(&local_a9);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TessellationShaderTestInstance::checkResult (VkQueryPool queryPool)
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	deUint64				result		= 0u;
	deUint64				expectedMin	= 0u;
	deUint64				expectedMax	= 0u;
	switch(m_parametersGraphic.queryStatisticFlags)
	{
		case VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_CONTROL_SHADER_PATCHES_BIT:
			expectedMin = 4u;
			expectedMax = expectedMin * 4u;
			break;
		case VK_QUERY_PIPELINE_STATISTIC_TESSELLATION_EVALUATION_SHADER_INVOCATIONS_BIT:
			expectedMin = 100u;
			expectedMax = expectedMin * 4u;
			break;
		default:
			DE_ASSERT(0);
			break;
	}
	VK_CHECK(vk.getQueryPoolResults(device, queryPool, 0u, 1u, sizeof(deUint64), &result, 0u, VK_QUERY_RESULT_64_BIT));
	if (result < expectedMin || result > expectedMax)
		return tcu::TestStatus::fail("QueryPoolResults incorrect");

	if (!checkImage())
		return tcu::TestStatus::fail("Result image doesn't match expected image.");

	return tcu::TestStatus::pass("Pass");
}